

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueStorage.hpp
# Opt level: O3

int __thiscall
supermap::KeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>::remove
          (KeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long> *this,
          char *__filename)

{
  NotImplementedException *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Remove for abstract KeyValueStorage","");
  supermap::NotImplementedException::NotImplementedException(this_00,(string *)local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

virtual void remove(const Key &) {
        throw NotImplementedException("Remove for abstract KeyValueStorage");
    }